

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void CoreML::Specification::MILSpec::protobuf_MIL_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/MIL.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  DAT_003a80f0 = (undefined8 *)0x0;
  _DAT_003a80f8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_003a8100 = (undefined8 *)0x0;
  uRam00000000003a8108 = 0;
  _DAT_003a8110 = 0;
  _Program_FunctionsEntry_default_instance_ = &PTR__MapEntryImpl_003a1288;
  DAT_003a8118 = 1;
  DAT_003a8128 = (undefined8 *)0x0;
  _DAT_003a8130 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_003a8138 = (undefined8 *)0x0;
  uRam00000000003a8140 = 0;
  _DAT_003a8148 = 0;
  _Program_AttributesEntry_default_instance_ = &PTR__MapEntryImpl_003a1408;
  DAT_003a8150 = 1;
  Program::Program((Program *)&_Program_default_instance_);
  DAT_003a81d0 = (undefined8 *)0x0;
  _DAT_003a81d8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_003a81e0 = (undefined8 *)0x0;
  uRam00000000003a81e8 = 0;
  _DAT_003a81f0 = 0;
  DAT_003a81c0 = 1;
  DAT_003a8208 = (undefined8 *)0x0;
  _DAT_003a8210 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_003a8218 = (undefined8 *)0x0;
  uRam00000000003a8220 = 0;
  _DAT_003a8228 = 0;
  _Function_BlockSpecializationsEntry_default_instance_ = &PTR__MapEntryImpl_003a1588;
  DAT_003a81f8 = 1;
  _Function_AttributesEntry_default_instance_ = &PTR__MapEntryImpl_003a1408;
  DAT_003a8230 = 1;
  Function::Function((Function *)&_Function_default_instance_);
  DAT_003a82c0 = (undefined8 *)0x0;
  _DAT_003a82c8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_003a82d0 = (undefined8 *)0x0;
  uRam00000000003a82d8 = 0;
  _DAT_003a82e0 = 0;
  DAT_003a82b0 = 1;
  _Block_AttributesEntry_default_instance_ = &PTR__MapEntryImpl_003a1408;
  DAT_003a82e8 = 1;
  Block::Block((Block *)&_Block_default_instance_);
  DAT_003a8370 = 1;
  Argument_Binding::Argument_Binding((Argument_Binding *)&_Argument_Binding_default_instance_);
  DAT_003a8398 = 1;
  Argument::Argument((Argument *)&_Argument_default_instance_);
  DAT_003a83f0 = (undefined8 *)0x0;
  _DAT_003a83f8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_003a8400 = (undefined8 *)0x0;
  uRam00000000003a8408 = 0;
  _DAT_003a8410 = 0;
  _Operation_InputsEntry_default_instance_ = &PTR__MapEntryImpl_003a1708;
  DAT_003a8428 = (undefined8 *)0x0;
  _DAT_003a8430 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_003a8438 = (undefined8 *)0x0;
  uRam00000000003a8440 = 0;
  _DAT_003a8448 = 0;
  DAT_003a83e0 = 1;
  DAT_003a8418 = 1;
  _Operation_AttributesEntry_default_instance_ = &PTR__MapEntryImpl_003a1408;
  DAT_003a8450 = 1;
  Operation::Operation((Operation *)&_Operation_default_instance_);
  DAT_003a84e8 = 1;
  NamedValueType::NamedValueType((NamedValueType *)&_NamedValueType_default_instance_);
  DAT_003a8518 = 1;
  ValueType::ValueType((ValueType *)&_ValueType_default_instance_);
  DAT_003a8570 = (undefined8 *)0x0;
  _DAT_003a8578 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  DAT_003a8580 = (undefined8 *)0x0;
  uRam00000000003a8588 = 0;
  _DAT_003a8590 = 0;
  DAT_003a8540 = 1;
  _TensorType_AttributesEntry_default_instance_ = &PTR__MapEntryImpl_003a1408;
  DAT_003a8598 = 1;
  TensorType::TensorType((TensorType *)&_TensorType_default_instance_);
  DAT_003a85f8 = 1;
  TupleType::TupleType((TupleType *)&_TupleType_default_instance_);
  DAT_003a8630 = 1;
  ListType::ListType((ListType *)&_ListType_default_instance_);
  DAT_003a8660 = 1;
  DictionaryType::DictionaryType((DictionaryType *)&_DictionaryType_default_instance_);
  DAT_003a8690 = 1;
  Dimension_ConstantDimension::Dimension_ConstantDimension
            ((Dimension_ConstantDimension *)&_Dimension_ConstantDimension_default_instance_);
  DAT_003a86b8 = 1;
  Dimension_UnknownDimension::Dimension_UnknownDimension
            ((Dimension_UnknownDimension *)&_Dimension_UnknownDimension_default_instance_);
  DAT_003a86d8 = 1;
  Dimension::Dimension((Dimension *)&_Dimension_default_instance_);
  DAT_003a8700 = 1;
  Value_ImmediateValue::Value_ImmediateValue
            ((Value_ImmediateValue *)&_Value_ImmediateValue_default_instance_);
  DAT_003a8738 = 1;
  Value_BlobFileValue::Value_BlobFileValue
            ((Value_BlobFileValue *)&_Value_BlobFileValue_default_instance_);
  DAT_003a8788 = 1;
  Value::Value((Value *)&_Value_default_instance_);
  DAT_003a87c0 = 1;
  TensorValue_RepeatedFloats::TensorValue_RepeatedFloats
            ((TensorValue_RepeatedFloats *)&_TensorValue_RepeatedFloats_default_instance_);
  DAT_003a8800 = 1;
  TensorValue_RepeatedDoubles::TensorValue_RepeatedDoubles
            ((TensorValue_RepeatedDoubles *)&_TensorValue_RepeatedDoubles_default_instance_);
  DAT_003a8830 = 1;
  TensorValue_RepeatedInts::TensorValue_RepeatedInts
            ((TensorValue_RepeatedInts *)&_TensorValue_RepeatedInts_default_instance_);
  DAT_003a8860 = 1;
  TensorValue_RepeatedLongInts::TensorValue_RepeatedLongInts
            ((TensorValue_RepeatedLongInts *)&_TensorValue_RepeatedLongInts_default_instance_);
  DAT_003a8890 = 1;
  TensorValue_RepeatedBools::TensorValue_RepeatedBools
            ((TensorValue_RepeatedBools *)&_TensorValue_RepeatedBools_default_instance_);
  DAT_003a88c0 = 1;
  TensorValue_RepeatedStrings::TensorValue_RepeatedStrings
            ((TensorValue_RepeatedStrings *)&_TensorValue_RepeatedStrings_default_instance_);
  DAT_003a88f8 = 1;
  TensorValue_RepeatedBytes::TensorValue_RepeatedBytes
            ((TensorValue_RepeatedBytes *)&_TensorValue_RepeatedBytes_default_instance_);
  DAT_003a8920 = 1;
  TensorValue::TensorValue((TensorValue *)&_TensorValue_default_instance_);
  DAT_003a8948 = 1;
  TupleValue::TupleValue((TupleValue *)&_TupleValue_default_instance_);
  DAT_003a89b8 = 1;
  ListValue::ListValue((ListValue *)&_ListValue_default_instance_);
  DAT_003a89f0 = 1;
  DictionaryValue_KeyValuePair::DictionaryValue_KeyValuePair
            ((DictionaryValue_KeyValuePair *)&_DictionaryValue_KeyValuePair_default_instance_);
  DAT_003a8a20 = 1;
  DictionaryValue::DictionaryValue((DictionaryValue *)&_DictionaryValue_default_instance_);
  DAT_003a80f0 = &_Program_FunctionsEntry_default_instance_;
  DAT_003a8100 = &_Function_default_instance_;
  DAT_003a81d0 = &_Function_BlockSpecializationsEntry_default_instance_;
  DAT_003a81e0 = &_Block_default_instance_;
  DAT_003a83f0 = &_Operation_InputsEntry_default_instance_;
  DAT_003a8400 = &_Argument_default_instance_;
  DAT_003a8648 = &_ValueType_default_instance_;
  DAT_003a8650 = &_Dimension_default_instance_;
  DAT_003a8128 = &_Program_AttributesEntry_default_instance_;
  DAT_003a8138 = &_Value_default_instance_;
  DAT_003a8208 = &_Function_AttributesEntry_default_instance_;
  DAT_003a8218 = &_Value_default_instance_;
  DAT_003a82c0 = &_Block_AttributesEntry_default_instance_;
  DAT_003a82d0 = &_Value_default_instance_;
  DAT_003a8428 = &_Operation_AttributesEntry_default_instance_;
  DAT_003a8438 = &_Value_default_instance_;
  DAT_003a8508 = &_ValueType_default_instance_;
  DAT_003a8570 = &_TensorType_AttributesEntry_default_instance_;
  DAT_003a8580 = &_Value_default_instance_;
  DAT_003a8678 = &_ValueType_default_instance_;
  DAT_003a8680 = &_ValueType_default_instance_;
  DAT_003a87a8 = &_ValueType_default_instance_;
  DAT_003a8a08 = &_Value_default_instance_;
  DAT_003a8a10 = &_Value_default_instance_;
  DAT_003a8a58 = 1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _Program_FunctionsEntry_default_instance_.DefaultConstruct();
  _Program_AttributesEntry_default_instance_.DefaultConstruct();
  _Program_default_instance_.DefaultConstruct();
  _Function_BlockSpecializationsEntry_default_instance_.DefaultConstruct();
  _Function_AttributesEntry_default_instance_.DefaultConstruct();
  _Function_default_instance_.DefaultConstruct();
  _Block_AttributesEntry_default_instance_.DefaultConstruct();
  _Block_default_instance_.DefaultConstruct();
  _Argument_Binding_default_instance_.DefaultConstruct();
  _Argument_default_instance_.DefaultConstruct();
  _Operation_InputsEntry_default_instance_.DefaultConstruct();
  _Operation_AttributesEntry_default_instance_.DefaultConstruct();
  _Operation_default_instance_.DefaultConstruct();
  _NamedValueType_default_instance_.DefaultConstruct();
  _ValueType_default_instance_.DefaultConstruct();
  _TensorType_AttributesEntry_default_instance_.DefaultConstruct();
  _TensorType_default_instance_.DefaultConstruct();
  _TupleType_default_instance_.DefaultConstruct();
  _ListType_default_instance_.DefaultConstruct();
  _DictionaryType_default_instance_.DefaultConstruct();
  _Dimension_ConstantDimension_default_instance_.DefaultConstruct();
  _Dimension_UnknownDimension_default_instance_.DefaultConstruct();
  _Dimension_default_instance_.DefaultConstruct();
  _Value_ImmediateValue_default_instance_.DefaultConstruct();
  _Value_BlobFileValue_default_instance_.DefaultConstruct();
  _Value_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedFloats_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedDoubles_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedInts_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedLongInts_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedBools_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedStrings_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedBytes_default_instance_.DefaultConstruct();
  _TensorValue_default_instance_.DefaultConstruct();
  _TupleValue_default_instance_.DefaultConstruct();
  _ListValue_default_instance_.DefaultConstruct();
  _DictionaryValue_KeyValuePair_default_instance_.DefaultConstruct();
  _DictionaryValue_default_instance_.DefaultConstruct();
  _Program_FunctionsEntry_default_instance_.get_mutable()->set_default_instance(_Program_FunctionsEntry_default_instance_.get_mutable());
  _Program_FunctionsEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Program_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_Program_AttributesEntry_default_instance_.get_mutable());
  _Program_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Function_BlockSpecializationsEntry_default_instance_.get_mutable()->set_default_instance(_Function_BlockSpecializationsEntry_default_instance_.get_mutable());
  _Function_BlockSpecializationsEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Function_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_Function_AttributesEntry_default_instance_.get_mutable());
  _Function_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Block_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_Block_AttributesEntry_default_instance_.get_mutable());
  _Block_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Operation_InputsEntry_default_instance_.get_mutable()->set_default_instance(_Operation_InputsEntry_default_instance_.get_mutable());
  _Operation_InputsEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Operation_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_Operation_AttributesEntry_default_instance_.get_mutable());
  _Operation_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _NamedValueType_default_instance_.get_mutable()->type_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _TensorType_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_TensorType_AttributesEntry_default_instance_.get_mutable());
  _TensorType_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _ListType_default_instance_.get_mutable()->type_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _ListType_default_instance_.get_mutable()->length_ = const_cast< ::CoreML::Specification::MILSpec::Dimension*>(
      ::CoreML::Specification::MILSpec::Dimension::internal_default_instance());
  _DictionaryType_default_instance_.get_mutable()->keytype_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _DictionaryType_default_instance_.get_mutable()->valuetype_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _Value_default_instance_.get_mutable()->type_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _DictionaryValue_KeyValuePair_default_instance_.get_mutable()->key_ = const_cast< ::CoreML::Specification::MILSpec::Value*>(
      ::CoreML::Specification::MILSpec::Value::internal_default_instance());
  _DictionaryValue_KeyValuePair_default_instance_.get_mutable()->value_ = const_cast< ::CoreML::Specification::MILSpec::Value*>(
      ::CoreML::Specification::MILSpec::Value::internal_default_instance());
}